

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O0

void __thiscall llbuild::buildsystem::Node::~Node(Node *this)

{
  code *pcVar1;
  Node *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Node::~Node() {}